

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::Option::each(Option *this,
                 function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *func)

{
  Option *in_RDI;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __x = &in_RDI->validators_;
  this_00 = &local_30;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)this_00,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)__x);
  ::std::__cxx11::string::string(this_00);
  ::std::vector<CLI::Validator,std::allocator<CLI::Validator>>::
  emplace_back<CLI::Option::each(std::function<void(std::__cxx11::string)>const&)::_lambda(std::__cxx11::string&)_1_,std::__cxx11::string>
            ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)this_00,
             (anon_class_32_1_898bcfc2 *)__x,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  each(std::function<void(std::__cxx11::string)>const&)::{lambda(std::__cxx11::string&)#1}::
  ~function((anon_class_32_1_898bcfc2 *)0x40d2a9);
  return in_RDI;
}

Assistant:

CLI11_INLINE Option *Option::each(const std::function<void(std::string)> &func) {
    validators_.emplace_back(
        [func](std::string &inout) {
            func(inout);
            return std::string{};
        },
        std::string{});
    return this;
}